

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_immediate_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_dbfc4::CpuImmediateTest_sbc_no_carry_but_overflow_Test::TestBody
          (CpuImmediateTest_sbc_no_carry_but_overflow_Test *this)

{
  CpuImmediateTest_sbc_no_carry_but_overflow_Test *this_local;
  
  (this->super_CpuImmediateTest).super_CpuTest.registers.a = 'P';
  (this->super_CpuImmediateTest).super_CpuTest.registers.p = '\x01';
  (this->super_CpuImmediateTest).super_CpuTest.expected.p = 0xc0;
  (this->super_CpuImmediateTest).super_CpuTest.expected.a = 0xa0;
  (this->super_CpuImmediateTest).super_CpuTest.field_0x114 = 0xb0;
  CpuImmediateTest::run_instruction(&this->super_CpuImmediateTest,0xe9);
  return;
}

Assistant:

TEST_F(CpuImmediateTest, sbc_no_carry_but_overflow) {
    registers.a = 0x50;
    registers.p = C_FLAG;
    expected.p = V_FLAG | N_FLAG;
    expected.a = 0xA0;
    memory_content = 0xB0;

    run_instruction(SBC_IMM);
}